

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll.c
# Opt level: O1

void sixt_update(void)

{
  getimage(0,10,0x27f,0x60,pic_temp_ram);
  putimage(0,0,pic_temp_ram,0);
  getimage(0,0x61,0x27f,0xb8,pic_temp_ram);
  putimage(0,0x57,pic_temp_ram,0);
  getimage(0,0xb9,0x27f,0x10f,pic_temp_ram);
  putimage(0,0xaf,pic_temp_ram,0);
  getimage(0,0x110,0x27f,0x15e,pic_temp_ram);
  putimage(0,0x106,pic_temp_ram,0);
  return;
}

Assistant:

void sixt_update(void) {
    getimage(0, 10, 639, 96, pic_temp_ram);
    putimage(0, 0, pic_temp_ram, 0);

    getimage(0, 97, 639, 184, pic_temp_ram);
    putimage(0, 87, pic_temp_ram, 0);

    getimage(0, 185, 639, 271, pic_temp_ram);
    putimage(0, 175, pic_temp_ram, 0);

    getimage(0, 272, 639, 350, pic_temp_ram);
    putimage(0, 262, pic_temp_ram, 0);
}